

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O3

void write_cdata(char *s,int length)

{
  byte bVar1;
  int iVar2;
  size_t __size;
  char *pcVar3;
  int iVar4;
  
  if (varused_test != 0) {
    varused = 1;
    return;
  }
  if (write_sourceview == 0) {
    if (length != -1) {
      putc(0x7b,(FILE *)code_file);
      if (0 < length) {
        pcVar3 = s + 1;
        iVar4 = 1;
        while( true ) {
          bVar1 = pcVar3[-1];
          iVar2 = 3 - (uint)(bVar1 < 10);
          if (99 < bVar1) {
            iVar2 = 4;
          }
          iVar4 = iVar4 + iVar2;
          if (0x4c < iVar4) {
            fputs("\n",(FILE *)code_file);
            iVar4 = 0;
          }
          fprintf((FILE *)code_file,"%d",(ulong)bVar1);
          if (s + length <= pcVar3) break;
          putc(0x2c,(FILE *)code_file);
          pcVar3 = pcVar3 + 1;
        }
      }
      putc(0x7d,(FILE *)code_file);
      return;
    }
    pcVar3 = "{ /* ... undefined size binary data... */ }";
    __size = 0x2b;
  }
  else {
    if (-1 < length) {
      fprintf((FILE *)code_file,"{ /* ... %d bytes of binary data... */ }",length);
      return;
    }
    pcVar3 = "{ /* ... binary data... */ }";
    __size = 0x1c;
  }
  fwrite(pcVar3,__size,1,(FILE *)code_file);
  return;
}

Assistant:

void write_cdata(const char *s, int length) {
  if (varused_test) {
    varused = 1;
    return;
  }
  if (write_sourceview) {
    if (length>=0)
      fprintf(code_file, "{ /* ... %d bytes of binary data... */ }", length);
    else
      fprintf(code_file, "{ /* ... binary data... */ }");
    return;
  }
  if (length==-1) {
    fprintf(code_file, "{ /* ... undefined size binary data... */ }");
    return;
  }
  const unsigned char *w = (const unsigned char *)s;
  const unsigned char *e = w+length;
  int linelength = 1;
  putc('{', code_file);
  for (; w < e;) {
    unsigned char c = *w++;
    if (c>99) linelength += 4;
    else if (c>9) linelength += 3;
    else linelength += 2;
    if (linelength >= 77) {fputs("\n",code_file); linelength = 0;}
    fprintf(code_file, "%d", c);
    if (w<e) putc(',', code_file);
  }
  putc('}', code_file);
}